

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O2

ggml_backend_graph_copy *
ggml_backend_graph_copy
          (ggml_backend_graph_copy *__return_storage_ptr__,ggml_backend_t backend,ggml_cgraph *graph
          )

{
  uint uVar1;
  ggml_init_params params;
  ggml_init_params params_00;
  ggml_hash_set hash_set_00;
  ggml_tensor **node_copies;
  _Bool *node_init;
  size_t sVar2;
  ggml_context *ctx;
  ggml_context *ctx_unallocated;
  ggml_backend_buffer *pgVar3;
  ggml_cgraph *pgVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  int i_1;
  long lVar7;
  ggml_hash_set hash_set;
  undefined7 uStack_4f;
  undefined7 uStack_37;
  
  ggml_hash_set_new(&hash_set,(graph->visited_hash_set).size);
  sVar2 = hash_set.size;
  node_copies = (ggml_tensor **)calloc(hash_set.size,8);
  node_init = (_Bool *)calloc(sVar2,1);
  sVar2 = ggml_tensor_overhead();
  lVar7 = sVar2 * hash_set.size;
  sVar2 = ggml_graph_overhead_custom((long)graph->size,false);
  uVar5 = sVar2 + lVar7;
  params._17_7_ = uStack_37;
  params.no_alloc = true;
  params.mem_buffer = (void *)0x0;
  params.mem_size = uVar5;
  ctx = ggml_init(params);
  params_00._17_7_ = uStack_4f;
  params_00.no_alloc = true;
  params_00.mem_buffer = (void *)0x0;
  params_00.mem_size = uVar5;
  ctx_unallocated = ggml_init(params_00);
  if (ctx_unallocated == (ggml_context *)0x0 || ctx == (ggml_context *)0x0) {
    ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate context for graph copy\n",
                      "ggml_backend_graph_copy");
    ggml_hash_set_free(&hash_set);
    free(node_copies);
    free(node_init);
    ggml_free(ctx);
  }
  else {
    for (lVar7 = 0; lVar7 < graph->n_nodes; lVar7 = lVar7 + 1) {
      hash_set_00.used = hash_set.used;
      hash_set_00.size = hash_set.size;
      hash_set_00.keys = hash_set.keys;
      graph_copy_dup_tensor(hash_set_00,node_copies,ctx,ctx_unallocated,graph->nodes[lVar7]);
    }
    pgVar3 = ggml_backend_alloc_ctx_tensors(ctx,backend);
    if (pgVar3 != (ggml_backend_buffer *)0x0) {
      for (lVar7 = 0; lVar7 < graph->n_nodes; lVar7 = lVar7 + 1) {
        graph_copy_init_tensor(&hash_set,node_copies,node_init,graph->nodes[lVar7]);
      }
      uVar6 = 0;
      pgVar4 = ggml_new_graph_custom(ctx,(long)graph->size,false);
      uVar1 = graph->n_nodes;
      uVar5 = 0;
      if (0 < (int)uVar1) {
        uVar5 = (ulong)uVar1;
      }
      for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        sVar2 = ggml_hash_find(&hash_set,graph->nodes[uVar6]);
        pgVar4->nodes[uVar6] = node_copies[sVar2];
      }
      pgVar4->n_nodes = uVar1;
      ggml_hash_set_free(&hash_set);
      free(node_copies);
      free(node_init);
      __return_storage_ptr__->buffer = pgVar3;
      __return_storage_ptr__->ctx_allocated = ctx;
      __return_storage_ptr__->ctx_unallocated = ctx_unallocated;
      __return_storage_ptr__->graph = pgVar4;
      return __return_storage_ptr__;
    }
    ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate buffer for graph copy\n",
                      "ggml_backend_graph_copy");
    ggml_hash_set_free(&hash_set);
    free(node_copies);
    free(node_init);
    ggml_free(ctx);
  }
  ggml_free(ctx_unallocated);
  __return_storage_ptr__->ctx_unallocated = (ggml_context *)0x0;
  __return_storage_ptr__->graph = (ggml_cgraph *)0x0;
  __return_storage_ptr__->buffer = (ggml_backend_buffer_t)0x0;
  __return_storage_ptr__->ctx_allocated = (ggml_context *)0x0;
  return __return_storage_ptr__;
}

Assistant:

struct ggml_backend_graph_copy ggml_backend_graph_copy(ggml_backend_t backend, struct ggml_cgraph * graph) {
    struct ggml_hash_set hash_set = ggml_hash_set_new(graph->visited_hash_set.size);
    struct ggml_tensor ** node_copies = (ggml_tensor **) calloc(hash_set.size, sizeof(node_copies[0])); // NOLINT
    bool * node_init = (bool *) calloc(hash_set.size, sizeof(node_init[0]));

    struct ggml_init_params params = {
        /* .mem_size   = */ ggml_tensor_overhead()*hash_set.size + ggml_graph_overhead_custom(graph->size, false),
        /* .mem_buffer = */ NULL,
        /* .no_alloc   = */ true
    };

    struct ggml_context * ctx_allocated = ggml_init(params);
    struct ggml_context * ctx_unallocated = ggml_init(params);

    if (ctx_allocated == NULL || ctx_unallocated == NULL) {
        GGML_LOG_ERROR("%s: failed to allocate context for graph copy\n", __func__);
        ggml_hash_set_free(&hash_set);
        free(node_copies);
        free(node_init);
        ggml_free(ctx_allocated);
        ggml_free(ctx_unallocated);
        return {
            /* .buffer           = */ NULL,
            /* .ctx_allocated    = */ NULL,
            /* .ctx_unallocated  = */ NULL,
            /* .graph            = */ NULL,
        };
    }

    // dup nodes
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        graph_copy_dup_tensor(hash_set, node_copies, ctx_allocated, ctx_unallocated, node);
    }

    // allocate nodes
    ggml_backend_buffer_t buffer = ggml_backend_alloc_ctx_tensors(ctx_allocated, backend);
    if (buffer == NULL) {
        GGML_LOG_ERROR("%s: failed to allocate buffer for graph copy\n", __func__);
        ggml_hash_set_free(&hash_set);
        free(node_copies);
        free(node_init);
        ggml_free(ctx_allocated);
        ggml_free(ctx_unallocated);
        return {
            /* .buffer           = */ NULL,
            /* .ctx_allocated    = */ NULL,
            /* .ctx_unallocated  = */ NULL,
            /* .graph            = */ NULL,
        };
    }

    //printf("copy buffer size: %zu MB\n", ggml_backend_buffer_get_size(buffer) / 1024 / 1024);

    // copy data and init views
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        graph_copy_init_tensor(&hash_set, node_copies, node_init, node);
    }

    // build graph copy
    struct ggml_cgraph * graph_copy = ggml_new_graph_custom(ctx_allocated, graph->size, false);
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        struct ggml_tensor * node_copy = node_copies[ggml_hash_find(&hash_set, node)];
        graph_copy->nodes[i] = node_copy;
    }
    graph_copy->n_nodes = graph->n_nodes;

    ggml_hash_set_free(&hash_set);
    free(node_copies);
    free(node_init);

    return {
        /* .buffer           = */ buffer,
        /* .ctx_allocated    = */ ctx_allocated,
        /* .ctx_unallocated  = */ ctx_unallocated,
        /* .graph            = */ graph_copy,
    };
}